

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,basic_string_view<char,_std::char_traits<char>_> *args)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  char *in_RCX;
  string_view s;
  string *local_b8;
  string_view local_98 [2];
  Formatter *local_78;
  char *pcStack_70;
  string *local_68;
  string local_60;
  iterator local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_30;
  basic_string_view<char,_std::char_traits<char>_> *local_20;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_68 = &local_60;
  local_78 = (Formatter *)args->_M_len;
  pcStack_70 = args->_M_str;
  s._M_str = in_RCX;
  s._M_len = (size_t)pcStack_70;
  local_20 = args;
  args_local = (basic_string_view<char,_std::char_traits<char>_> *)format;
  format_local = (char *)this;
  ToString_abi_cxx11_(local_68,local_78,s);
  local_40 = &local_60;
  local_38 = 1;
  v._M_len = 1;
  v._M_array = local_40;
  absl::lts_20250127::Span<std::__cxx11::string_const>::
  Span<std::__cxx11::string_const,std::__cxx11::string_const>
            ((Span<std::__cxx11::string_const> *)local_30._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_98,(char *)args_local);
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (this_00,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_30,&this->vars_,local_98[0]);
  local_b8 = (string *)&local_40;
  do {
    local_b8 = local_b8 + -1;
    std::__cxx11::string::~string((string *)local_b8);
  } while (local_b8 != &local_60);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }